

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

int magma_cipher_do_ctr(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  byte bVar1;
  byte *out_00;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  uint local_5c;
  byte *local_58;
  ossl_gost_cipher_ctx *local_50;
  ossl_gost_cipher_ctx *local_48;
  EVP_CIPHER_CTX *local_40;
  size_t local_38;
  
  local_50 = (ossl_gost_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data();
  local_48 = local_50;
  out_00 = (byte *)EVP_CIPHER_CTX_buf_noconst(ctx);
  local_58 = (byte *)EVP_CIPHER_CTX_iv_noconst(ctx);
  local_40 = ctx;
  local_5c = EVP_CIPHER_CTX_get_num(ctx);
  sVar6 = inl;
  while( true ) {
    if (((local_5c & 7) == 0) || (sVar6 == 0)) break;
    bVar1 = *in;
    in = in + 1;
    *out = out_00[local_5c & 7] ^ bVar1;
    out = out + 1;
    local_5c = local_5c + 1;
    sVar6 = sVar6 - 1;
  }
  uVar4 = sVar6 >> 3;
  local_48 = (ossl_gost_cipher_ctx *)&local_48->cctx;
  local_38 = inl;
  for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
    apply_acpkm_magma(local_50,&local_5c);
    magmacrypt((gost_ctx *)local_48,local_58,out_00);
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      out[lVar2] = in[lVar2] ^ out_00[lVar2];
    }
    ctr64_inc(local_58);
    local_50->count = local_50->count + 8;
    in = in + 8;
    out = out + 8;
    local_5c = local_5c + 8;
    sVar6 = sVar6 - 8;
  }
  uVar5 = local_5c;
  if (sVar6 != 0) {
    apply_acpkm_magma(local_50,&local_5c);
    magmacrypt((gost_ctx *)local_48,local_58,out_00);
    for (uVar3 = 0; uVar3 < sVar6; uVar3 = uVar3 + 1) {
      out[uVar3] = in[uVar3] ^ out_00[uVar3];
    }
    ctr64_inc(local_58);
    local_50->count = local_50->count + 8;
    uVar5 = (int)sVar6 + local_5c;
  }
  EVP_CIPHER_CTX_set_num(local_40,uVar5);
  return (int)local_38;
}

Assistant:

static int magma_cipher_do_ctr(EVP_CIPHER_CTX *ctx, unsigned char *out,
                               const unsigned char *in, size_t inl)
{
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    size_t j;
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    unsigned int num = EVP_CIPHER_CTX_num(ctx);
    size_t blocks, i, lasted = inl;
/* Process partial blocks */
    while ((num & MAGMA_BLOCK_MASK) && lasted) {
        *out_ptr++ = *in_ptr++ ^ buf[num & MAGMA_BLOCK_MASK];
        --lasted;
        num++;
    }
    blocks = lasted / MAGMA_BLOCK_SIZE;

/* Process full blocks */
    for (i = 0; i < blocks; i++) {
        apply_acpkm_magma(c, &num);
        magmacrypt(&(c->cctx), iv, buf);
        for (j = 0; j < 8; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        ctr64_inc(iv);
        c->count += MAGMA_BLOCK_SIZE;
        in_ptr += MAGMA_BLOCK_SIZE;
        out_ptr += MAGMA_BLOCK_SIZE;
        num += MAGMA_BLOCK_SIZE;
        lasted -= MAGMA_BLOCK_SIZE;
    }

/* Process the rest of plaintext */
    if (lasted > 0) {
        apply_acpkm_magma(c, &num);
        magmacrypt(&(c->cctx), iv, buf);

        for (i = 0; i < lasted; i++)
            out_ptr[i] = buf[i] ^ in_ptr[i];
        ctr64_inc(iv);
        c->count += 8;
        num += lasted;
    }
    EVP_CIPHER_CTX_set_num(ctx, num);

    return inl;
}